

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O3

Vec3fa __thiscall embree::avx2::LineSegmentsISA::computeDirection(LineSegmentsISA *this,uint primID)

{
  uint uVar1;
  RefCount RVar2;
  ulong in_RDX;
  undefined4 in_register_00000034;
  long lVar3;
  undefined8 in_XMM1_Qa;
  Vec3fa VVar4;
  
  lVar3 = CONCAT44(in_register_00000034,primID);
  uVar1 = *(uint *)(*(long *)(lVar3 + 0x58) + (in_RDX & 0xffffffff) * *(long *)(lVar3 + 0x68));
  RVar2 = (RefCount)
          vsubps_avx(*(undefined1 (*) [16])
                      (*(long *)(lVar3 + 0x90) + (ulong)(uVar1 + 1) * *(long *)(lVar3 + 0xa0)),
                     *(undefined1 (*) [16])
                      (*(long *)(lVar3 + 0x90) + (ulong)uVar1 * *(long *)(lVar3 + 0xa0)));
  (this->super_LineSegments).super_Geometry.super_RefCount = RVar2;
  VVar4.field_0._0_8_ = RVar2._vptr_RefCount;
  VVar4.field_0._8_8_ = in_XMM1_Qa;
  return (Vec3fa)VVar4.field_0;
}

Assistant:

Vec3fa computeDirection(unsigned int primID) const
      {
        const unsigned vtxID = segment(primID);
        const Vec3fa v0 = vertex(vtxID+0);
        const Vec3fa v1 = vertex(vtxID+1);
        return v1-v0;
      }